

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * createTableStmt(sqlite3 *db,Table *p)

{
  short sVar1;
  _func_int_sqlite3_context_ptr_sqlite3_uint64 *__s;
  uint uVar2;
  char *zBuf;
  size_t sVar3;
  long lVar4;
  Column *pCVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  int k;
  uint local_50;
  int local_4c;
  char *local_48;
  Table *local_40;
  char *local_38;
  
  sVar1 = p->nCol;
  if (0 < sVar1) {
    pCVar5 = p->aCol;
    iVar6 = 0;
    iVar8 = 0;
LAB_001859a0:
    pcVar9 = pCVar5->zName;
    iVar7 = 0;
    do {
      if (*pcVar9 == '\"') {
        iVar7 = iVar7 + 1;
      }
      else if (*pcVar9 == '\0') goto LAB_001859bf;
      iVar7 = iVar7 + 1;
      pcVar9 = pcVar9 + 1;
    } while( true );
  }
  iVar7 = 2;
LAB_001859dc:
  pcVar9 = p->zName;
  iVar6 = 0;
  do {
    if (*pcVar9 == '\"') {
      iVar6 = iVar6 + 1;
    }
    else if (*pcVar9 == '\0') {
      iVar7 = iVar7 + iVar6;
      local_38 = ",\n  ";
      if (iVar7 < 0x32) {
        local_38 = ",";
      }
      pcVar9 = "\n)";
      if (iVar7 < 0x32) {
        pcVar9 = ")";
      }
      iVar6 = iVar7 + 0x23 + sVar1 * 6;
      zBuf = (char *)sqlite3Malloc((long)iVar6);
      if (zBuf == (char *)0x0) {
        sqlite3OomFault(db);
        zBuf = (char *)0x0;
      }
      else {
        local_48 = pcVar9;
        sqlite3_snprintf(iVar6,zBuf,"CREATE TABLE ");
        sVar3 = strlen(zBuf);
        local_50 = (uint)sVar3 & 0x3fffffff;
        identPut(zBuf,(int *)&local_50,p->zName);
        lVar4 = (long)(int)local_50;
        local_50 = local_50 + 1;
        zBuf[lVar4] = '(';
        if (0 < p->nCol) {
          pCVar5 = p->aCol;
          pcVar9 = "\n  ";
          if (iVar7 < 0x32) {
            pcVar9 = "";
          }
          iVar7 = 0;
          local_4c = iVar6;
          local_40 = p;
          do {
            uVar2 = local_50;
            lVar4 = (long)(int)local_50;
            sqlite3_snprintf(local_4c - local_50,zBuf + lVar4,pcVar9);
            sVar3 = strlen(zBuf + lVar4);
            local_50 = ((uint)sVar3 & 0x3fffffff) + uVar2;
            identPut(zBuf,(int *)&local_50,pCVar5->zName);
            __s = (&sqlite3Apis.result_zeroblob64)[pCVar5->affinity];
            sVar3 = strlen((char *)__s);
            uVar2 = local_50;
            memcpy(zBuf + (int)local_50,__s,(ulong)((uint)sVar3 & 0x3fffffff));
            local_50 = uVar2 + ((uint)sVar3 & 0x3fffffff);
            iVar7 = iVar7 + 1;
            pCVar5 = pCVar5 + 1;
            pcVar9 = local_38;
            iVar6 = local_4c;
          } while (iVar7 < local_40->nCol);
        }
        sqlite3_snprintf(iVar6 - local_50,zBuf + (int)local_50,"%s",local_48);
      }
      return zBuf;
    }
    iVar6 = iVar6 + 1;
    pcVar9 = pcVar9 + 1;
  } while( true );
LAB_001859bf:
  iVar7 = iVar8 + iVar7;
  iVar8 = iVar7 + 7;
  iVar6 = iVar6 + 1;
  pCVar5 = pCVar5 + 1;
  if (iVar6 == sVar1) goto code_r0x001859d0;
  goto LAB_001859a0;
code_r0x001859d0:
  iVar7 = iVar7 + 9;
  goto LAB_001859dc;
}

Assistant:

static char *createTableStmt(sqlite3 *db, Table *p){
  int i, k, n;
  char *zStmt;
  char *zSep, *zSep2, *zEnd;
  Column *pCol;
  n = 0;
  for(pCol = p->aCol, i=0; i<p->nCol; i++, pCol++){
    n += identLength(pCol->zName) + 5;
  }
  n += identLength(p->zName);
  if( n<50 ){ 
    zSep = "";
    zSep2 = ",";
    zEnd = ")";
  }else{
    zSep = "\n  ";
    zSep2 = ",\n  ";
    zEnd = "\n)";
  }
  n += 35 + 6*p->nCol;
  zStmt = sqlite3DbMallocRaw(0, n);
  if( zStmt==0 ){
    sqlite3OomFault(db);
    return 0;
  }
  sqlite3_snprintf(n, zStmt, "CREATE TABLE ");
  k = sqlite3Strlen30(zStmt);
  identPut(zStmt, &k, p->zName);
  zStmt[k++] = '(';
  for(pCol=p->aCol, i=0; i<p->nCol; i++, pCol++){
    static const char * const azType[] = {
        /* SQLITE_AFF_BLOB    */ "",
        /* SQLITE_AFF_TEXT    */ " TEXT",
        /* SQLITE_AFF_NUMERIC */ " NUM",
        /* SQLITE_AFF_INTEGER */ " INT",
        /* SQLITE_AFF_REAL    */ " REAL"
    };
    int len;
    const char *zType;

    sqlite3_snprintf(n-k, &zStmt[k], zSep);
    k += sqlite3Strlen30(&zStmt[k]);
    zSep = zSep2;
    identPut(zStmt, &k, pCol->zName);
    assert( pCol->affinity-SQLITE_AFF_BLOB >= 0 );
    assert( pCol->affinity-SQLITE_AFF_BLOB < ArraySize(azType) );
    testcase( pCol->affinity==SQLITE_AFF_BLOB );
    testcase( pCol->affinity==SQLITE_AFF_TEXT );
    testcase( pCol->affinity==SQLITE_AFF_NUMERIC );
    testcase( pCol->affinity==SQLITE_AFF_INTEGER );
    testcase( pCol->affinity==SQLITE_AFF_REAL );
    
    zType = azType[pCol->affinity - SQLITE_AFF_BLOB];
    len = sqlite3Strlen30(zType);
    assert( pCol->affinity==SQLITE_AFF_BLOB 
            || pCol->affinity==sqlite3AffinityType(zType, 0) );
    memcpy(&zStmt[k], zType, len);
    k += len;
    assert( k<=n );
  }
  sqlite3_snprintf(n-k, &zStmt[k], "%s", zEnd);
  return zStmt;
}